

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testSize<Imath_3_2::Vec4<short>>(char *type)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  short *psVar4;
  char *in_RDI;
  Box<Imath_3_2::Vec4<short>_> b_1;
  Vec4<short> max;
  Vec4<short> min;
  Box<Imath_3_2::Vec4<short>_> b1;
  uint i;
  Vec4<short> p;
  Box<Imath_3_2::Vec4<short>_> b0;
  Box<Imath_3_2::Vec4<short>_> b;
  undefined6 in_stack_ffffffffffffff38;
  short in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff44;
  Box<Imath_3_2::Vec4<short>_> *in_stack_ffffffffffffff48;
  Box<Imath_3_2::Vec4<short>_> *in_stack_ffffffffffffff50;
  Vec4<short> local_a4;
  Vec4<short> local_9c;
  Vec4<short> local_94;
  Vec4<short> local_8c;
  Vec4<short> local_84 [4];
  uint local_64;
  Vec4<short> local_60;
  Vec4<short> local_58;
  Vec4<short> local_50;
  Vec4<short> local_48;
  Vec4<short> local_40 [3];
  Vec4<short> local_28;
  Vec4<short> local_20 [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    size() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
            ((Box<Imath_3_2::Vec4<short>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec4<short>::Vec4(&local_28,0);
  bVar1 = Imath_3_2::Vec4<short>::operator==(local_20,&local_28);
  if (!bVar1) {
    __assert_fail("b.size () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x268,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec4<short>]")
    ;
  }
  Imath_3_2::Vec4<short>::Vec4(local_40,-1);
  Imath_3_2::Vec4<short>::Vec4(&local_48,1);
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec4<short> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec4<short>::Vec4(&local_58,2);
  bVar1 = Imath_3_2::Vec4<short>::operator==(&local_50,&local_58);
  if (!bVar1) {
    __assert_fail("b0.size () == T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x27a,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec4<short>]")
    ;
  }
  Imath_3_2::Vec4<short>::Vec4(&local_60);
  local_64 = 0;
  while( true ) {
    uVar5 = local_64;
    uVar2 = Imath_3_2::Vec4<short>::dimensions();
    if (uVar2 <= uVar5) break;
    in_stack_ffffffffffffff3e = (short)local_64;
    psVar4 = Imath_3_2::Vec4<short>::operator[](&local_60,local_64);
    *psVar4 = in_stack_ffffffffffffff3e;
    local_64 = local_64 + 1;
  }
  Imath_3_2::Vec4<short>::operator-
            ((Vec4<short> *)CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec4<short> *)CONCAT44(in_stack_ffffffffffffff44,uVar5));
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec4<short>::Vec4(&local_94,2);
  Imath_3_2::Vec4<short>::operator*
            (&in_stack_ffffffffffffff48->min,
             (Vec4<short> *)CONCAT44(in_stack_ffffffffffffff44,uVar5));
  bVar1 = Imath_3_2::Vec4<short>::operator==(local_84,&local_8c);
  if (!bVar1) {
    __assert_fail("b1.size () == p * T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x282,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec4<short>]")
    ;
  }
  Imath_3_2::Vec4<short>::Vec4(&local_9c,0);
  Imath_3_2::Vec4<short>::Vec4(&local_a4,&local_9c);
  uVar2 = Imath_3_2::Vec4<short>::dimensions();
  psVar4 = Imath_3_2::Vec4<short>::operator[](&local_a4,uVar2 - 1);
  *psVar4 = 1;
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec4<short> *)CONCAT44(in_stack_ffffffffffffff44,uVar5));
  Imath_3_2::Box<Imath_3_2::Vec4<short>_>::size(in_stack_ffffffffffffff48);
  bVar1 = Imath_3_2::Vec4<short>::operator==((Vec4<short> *)&stack0xffffffffffffff44,&local_a4);
  if (!bVar1) {
    __assert_fail("b.size () == max",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x293,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec4<short>]")
    ;
  }
  return;
}

Assistant:

void
testSize (const char* type)
{
    cout << "    size() for type " << type << endl;

    //
    // Size of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.size () == T (0));
    }

    //
    // Size of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ]
    //
    // and
    //
    //    2D: [(-1, -2),         (1, 2)       ]
    //    3D: [(-1, -2, -3),     (1, 2, 3)    ]
    //    4D: [(-1, -2, -3, -4), (1, 2, 3, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.size () == T (2));

        T p;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            p[i] = static_cast<typename T::BaseType>(i);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (-p, p);
        assert (b1.size () == p * T (2));
    }

    //
    // Size of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 1)      ]
    //    3D: [(0, 0, 0),    (0, 0, 1)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 1)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 1;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (b.size () == max);
    }
}